

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::logAndSetTestResult
          (UploadWaitDrawCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestLog *pTVar4;
  pointer piVar5;
  pointer pRVar6;
  TestLog *pTVar7;
  TestContext *this_00;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  pointer pSVar14;
  SampleBuilder *pSVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  size_type __dnew;
  ScopedLogSection section;
  ScopedLogSection section_1;
  size_type __dnew_1;
  ostringstream s;
  vector<int,_std::allocator<int>_> runOrder;
  size_type __dnew_2;
  LogValueInfo local_830;
  int local_7c8;
  int local_7c4;
  ScopedLogSection local_7c0;
  undefined1 local_7b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a8;
  string local_798;
  string local_778;
  qpSampleValueTag local_758;
  LogValueInfo local_750;
  undefined1 local_6e8 [8];
  pointer local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_6d8;
  string local_6c8;
  string local_6a8;
  qpSampleValueTag local_688;
  deInt64 local_680;
  ios_base local_678 [8];
  ios_base local_670 [264];
  vector<int,_std::allocator<int>_> local_568;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  string local_1f0;
  string local_1d0;
  qpSampleValueTag local_1b0;
  LogSampleList local_1a8;
  LogValueInfo local_168;
  LogValueInfo local_100;
  LogValueInfo local_98;
  
  pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_6e8 = (undefined1  [8])&aStack_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"Samples","");
  local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"Result samples","");
  tcu::ScopedLogSection::ScopedLogSection(&local_7c0,pTVar4,(string *)local_6e8,&local_830.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    local_830.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_6e8 != (undefined1  [8])&aStack_6d8) {
    operator_delete((void *)local_6e8,aStack_6d8._M_allocated_capacity + 1);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_568,
             (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)local_6e8);
  piVar5 = (this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)(this->m_iterationOrder).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar5) >> 2);
  if (0 < (int)uVar16) {
    uVar18 = 0;
    do {
      local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar5[uVar18]] = (int)uVar18;
      uVar18 = uVar18 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar18);
  }
  pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  local_2b0.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_2b0._M_string_length = 7;
  local_2b0.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  local_2d0.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_2d0._M_string_length = 7;
  local_2d0.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  tcu::LogSampleList::LogSampleList(&local_1a8,&local_2b0,&local_2d0);
  tcu::TestLog::startSampleList(pTVar4,&local_1a8.m_name,&local_1a8.m_description);
  tcu::TestLog::startSampleInfo(pTVar4);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_2f0.field_2._M_allocated_capacity = 0x73706177536d754e;
  local_2f0._M_string_length = 8;
  local_2f0.field_2._M_local_buf[8] = '\0';
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  local_830.m_name._M_dataplus._M_p = (pointer)0x16;
  local_510._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_510,(ulong)&local_830);
  local_510.field_2._M_allocated_capacity = (size_type)local_830.m_name._M_dataplus._M_p;
  builtin_strncpy(local_510._M_dataplus._M_p,"SwapBuffers before use",0x16);
  local_510._M_string_length = (size_type)local_830.m_name._M_dataplus._M_p;
  local_510._M_dataplus._M_p[(long)local_830.m_name._M_dataplus._M_p] = '\0';
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310._M_string_length = 0;
  local_310.field_2._M_local_buf[0] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_6e8,&local_2f0,&local_510,&local_310,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(pTVar4,(string *)local_6e8,&local_6c8,&local_6a8,local_688);
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  local_330.field_2._M_allocated_capacity._0_4_ = 0x616c6544;
  local_330.field_2._M_allocated_capacity._4_2_ = 0x79;
  local_330._M_string_length = 5;
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350.field_2._M_allocated_capacity._0_7_ = 0x656220656d6954;
  local_350.field_2._M_local_buf[7] = 'f';
  local_350.field_2._8_7_ = 0x6573752065726f;
  local_350._M_string_length = 0xf;
  local_350.field_2._M_local_buf[0xf] = '\0';
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  local_370.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_370._M_string_length = 2;
  local_370.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            (&local_830,&local_330,&local_350,&local_370,QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo
            (pTVar4,&local_830.m_name,&local_830.m_description,&local_830.m_unit,local_830.m_tag);
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  local_390.field_2._M_allocated_capacity = 0x726564724f6e7552;
  local_390._M_string_length = 8;
  local_390.field_2._M_local_buf[8] = '\0';
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  local_750.m_name._M_dataplus._M_p = &DAT_00000010;
  local_530._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_530,(ulong)&local_750);
  local_530.field_2._M_allocated_capacity = (size_type)local_750.m_name._M_dataplus._M_p;
  builtin_strncpy(local_530._M_dataplus._M_p,"Sample run order",0x10);
  local_530._M_string_length = (size_type)local_750.m_name._M_dataplus._M_p;
  local_530._M_dataplus._M_p[(long)local_750.m_name._M_dataplus._M_p] = '\0';
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_7b8,&local_390,&local_530,&local_3b0,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo
            (pTVar4,(string *)local_7b8,(string *)(local_7b8 + 0x20),(string *)(local_7b8 + 0x40),
             local_758);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0.field_2._M_allocated_capacity = 0x6461655277617244;
  local_3d0.field_2._8_4_ = 0x656d6954;
  local_3d0._M_string_length = 0xc;
  local_3d0.field_2._M_local_buf[0xc] = '\0';
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  local_210._0_8_ = (TestLog *)0x1d;
  local_550._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_550,(ulong)local_210);
  local_550.field_2._M_allocated_capacity = local_210._0_8_;
  builtin_strncpy(local_550._M_dataplus._M_p,"Draw call and ReadPixels time",0x1d);
  local_550._M_string_length = local_210._0_8_;
  local_550._M_dataplus._M_p[local_210._0_8_] = '\0';
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_3f0._M_string_length = 2;
  local_3f0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            (&local_750,&local_3d0,&local_550,&local_3f0,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (pTVar4,&local_750.m_name,&local_750.m_description,&local_750.m_unit,local_750.m_tag);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_410.field_2._8_2_ = 0x65;
  local_410._M_string_length = 9;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_430.field_2._8_2_ = 0x656d;
  local_430._M_string_length = 10;
  local_430.field_2._M_local_buf[10] = '\0';
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_450.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_450._M_string_length = 2;
  local_450.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_210,&local_410,&local_430,&local_450,QP_SAMPLE_VALUE_TAG_RESPONSE
            );
  tcu::TestLog::writeValueInfo
            (pTVar4,(string *)local_210,(string *)(local_210 + 0x20),(string *)(local_210 + 0x40),
             local_1b0);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_470.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_470.field_2._7_4_ = 0x656d6974;
  local_470._M_string_length = 0xb;
  local_470.field_2._M_local_buf[0xb] = '\0';
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  local_490.field_2._M_allocated_capacity._0_7_ = 0x2064616f6c7055;
  local_490.field_2._7_4_ = 0x656d6974;
  local_490._M_string_length = 0xb;
  local_490.field_2._M_local_buf[0xb] = '\0';
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4b0._M_string_length = 2;
  local_4b0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            (&local_98,&local_470,&local_490,&local_4b0,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (pTVar4,&local_98.m_name,&local_98.m_description,&local_98.m_unit,local_98.m_tag);
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  local_4d0.field_2._M_allocated_capacity = 0x6c6c614377617244;
  local_4d0.field_2._8_4_ = 0x656d6954;
  local_4d0._M_string_length = 0xc;
  local_4d0.field_2._M_local_buf[0xc] = '\0';
  local_230.field_2._M_allocated_capacity._0_6_ = 0x632077617244;
  local_230.field_2._M_allocated_capacity._6_2_ = 0x6c61;
  local_230.field_2._8_6_ = 0x656d6974206c;
  local_230._M_string_length = 0xe;
  local_230.field_2._M_local_buf[0xe] = '\0';
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  local_4f0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4f0._M_string_length = 2;
  local_4f0.field_2._M_local_buf[2] = '\0';
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  tcu::LogValueInfo::LogValueInfo
            (&local_100,&local_4d0,&local_230,&local_4f0,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (pTVar4,&local_100.m_name,&local_100.m_description,&local_100.m_unit,local_100.m_tag);
  local_250.field_2._M_allocated_capacity = 0x656d695464616552;
  local_250._M_string_length = 8;
  local_250.field_2._M_local_buf[8] = '\0';
  local_270.field_2._M_allocated_capacity._0_7_ = 0x78695064616552;
  local_270.field_2._M_local_buf[7] = 'e';
  local_270.field_2._8_7_ = 0x656d697420736c;
  local_270._M_string_length = 0xf;
  local_270.field_2._M_local_buf[0xf] = '\0';
  local_290.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_290._M_string_length = 2;
  local_290.field_2._M_local_buf[2] = '\0';
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  tcu::LogValueInfo::LogValueInfo
            (&local_168,&local_250,&local_270,&local_290,QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (pTVar4,&local_168.m_name,&local_168.m_description,&local_168.m_unit,local_168.m_tag);
  tcu::TestLog::endSampleInfo(pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_unit._M_dataplus._M_p != &local_168.m_unit.field_2) {
    operator_delete(local_168.m_unit._M_dataplus._M_p,
                    local_168.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_description._M_dataplus._M_p != &local_168.m_description.field_2) {
    operator_delete(local_168.m_description._M_dataplus._M_p,
                    local_168.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_name._M_dataplus._M_p != &local_168.m_name.field_2) {
    operator_delete(local_168.m_name._M_dataplus._M_p,
                    local_168.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT53(local_290.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_290.field_2._M_local_buf[2],
                                      local_290.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT17(local_270.field_2._M_local_buf[7],
                             local_270.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_unit._M_dataplus._M_p != &local_100.m_unit.field_2) {
    operator_delete(local_100.m_unit._M_dataplus._M_p,
                    local_100.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_name._M_dataplus._M_p != &local_100.m_name.field_2) {
    operator_delete(local_100.m_name._M_dataplus._M_p,
                    local_100.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,
                    CONCAT53(local_4f0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4f0.field_2._M_local_buf[2],
                                      local_4f0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT26(local_230.field_2._M_allocated_capacity._6_2_,
                             local_230.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_unit._M_dataplus._M_p != &local_98.m_unit.field_2) {
    operator_delete(local_98.m_unit._M_dataplus._M_p,
                    local_98.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_description._M_dataplus._M_p != &local_98.m_description.field_2) {
    operator_delete(local_98.m_description._M_dataplus._M_p,
                    local_98.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_name._M_dataplus._M_p != &local_98.m_name.field_2) {
    operator_delete(local_98.m_name._M_dataplus._M_p,
                    local_98.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT53(local_4b0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4b0.field_2._M_local_buf[2],
                                      local_4b0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,
                    CONCAT17(local_490.field_2._M_local_buf[7],
                             local_490.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT17(local_470.field_2._M_local_buf[7],
                             local_470.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (local_1d0._M_dataplus._M_p != local_210 + 0x50) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0._M_dataplus._M_p != local_210 + 0x30) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_210._0_8_ != (TestLog *)(local_210 + 0x10)) {
    operator_delete((void *)local_210._0_8_,local_200._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT53(local_450.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_450.field_2._M_local_buf[2],
                                      local_450.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750.m_unit._M_dataplus._M_p != &local_750.m_unit.field_2) {
    operator_delete(local_750.m_unit._M_dataplus._M_p,
                    local_750.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750.m_description._M_dataplus._M_p != &local_750.m_description.field_2) {
    operator_delete(local_750.m_description._M_dataplus._M_p,
                    local_750.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750.m_name._M_dataplus._M_p != &local_750.m_name.field_2) {
    operator_delete(local_750.m_name._M_dataplus._M_p,
                    local_750.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT53(local_3f0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3f0.field_2._M_local_buf[2],
                                      local_3f0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,(ulong)(local_550.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if (local_778._M_dataplus._M_p != local_7b8 + 0x50) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if (local_798._M_dataplus._M_p != local_7b8 + 0x30) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_7b8._0_8_ != (TestLog *)(local_7b8 + 0x10)) {
    operator_delete((void *)local_7b8._0_8_,local_7a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,
                    CONCAT71(local_3b0.field_2._M_allocated_capacity._1_7_,
                             local_3b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,(ulong)(local_530.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_unit._M_dataplus._M_p != &local_830.m_unit.field_2) {
    operator_delete(local_830.m_unit._M_dataplus._M_p,
                    local_830.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_description._M_dataplus._M_p != &local_830.m_description.field_2) {
    operator_delete(local_830.m_description._M_dataplus._M_p,
                    local_830.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    local_830.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,
                    CONCAT53(local_370.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_370.field_2._M_local_buf[2],
                                      local_370.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,
                    CONCAT17(local_350.field_2._M_local_buf[7],
                             local_350.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,
                    CONCAT26(local_330.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_330.field_2._M_allocated_capacity._4_2_,
                                      local_330.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if (local_6e8 != (undefined1  [8])&aStack_6d8) {
    operator_delete((void *)local_6e8,aStack_6d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,
                    CONCAT71(local_310.field_2._M_allocated_capacity._1_7_,
                             local_310.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,(ulong)(local_510.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_description._M_dataplus._M_p != &local_1a8.m_description.field_2) {
    operator_delete(local_1a8.m_description._M_dataplus._M_p,
                    local_1a8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.m_name._M_dataplus._M_p != &local_1a8.m_name.field_2) {
    operator_delete(local_1a8.m_name._M_dataplus._M_p,
                    local_1a8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,
                    CONCAT44(local_2d0.field_2._M_allocated_capacity._4_4_,
                             local_2d0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT44(local_2b0.field_2._M_allocated_capacity._4_4_,
                             local_2b0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  pSVar14 = (this->m_samples).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_samples).
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14) >> 4)) {
    lVar19 = 0;
    lVar17 = 0;
    lVar20 = 0;
    do {
      local_6e8 = (undefined1  [8])
                  ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
      local_6e0 = (pointer)0x0;
      aStack_6d8._M_allocated_capacity = 0;
      aStack_6d8._8_8_ = 0;
      pSVar15 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_6e8,*(int *)((long)&pSVar14->numFrames + lVar19));
      pSVar15 = tcu::SampleBuilder::operator<<
                          (pSVar15,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  timeBeforeUse + lVar17));
      pSVar15 = tcu::SampleBuilder::operator<<
                          (pSVar15,local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar20]);
      pSVar15 = tcu::SampleBuilder::operator<<
                          (pSVar15,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  renderReadDuration + lVar17));
      pRVar6 = (this->m_results).
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar15 = tcu::SampleBuilder::operator<<
                          (pSVar15,*(int *)((long)&pRVar6->uploadDuration + lVar17) +
                                   *(int *)((long)&pRVar6->renderReadDuration + lVar17));
      pSVar15 = tcu::SampleBuilder::operator<<
                          (pSVar15,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  uploadDuration + lVar17));
      pSVar15 = tcu::SampleBuilder::operator<<
                          (pSVar15,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  renderDuration + lVar17));
      pSVar15 = tcu::SampleBuilder::operator<<
                          (pSVar15,*(int *)((long)&((this->m_results).
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  readDuration + lVar17));
      tcu::SampleBuilder::operator<<(pSVar15,(EndSampleToken *)&tcu::TestLog::EndSample);
      if (local_6e0 != (pointer)0x0) {
        operator_delete(local_6e0,aStack_6d8._8_8_ - (long)local_6e0);
      }
      lVar20 = lVar20 + 1;
      pSVar14 = (this->m_samples).
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x28;
      lVar19 = lVar19 + 0x10;
    } while (lVar20 < (int)((ulong)((long)(this->m_samples).
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Sample>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar14
                                   ) >> 4));
  }
  tcu::TestLog::endSampleList
            (((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log);
  if (local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_568.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::TestLog::endSection(local_7c0.m_log);
  pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_6e8 = (undefined1  [8])&aStack_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"Stabilization","");
  local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"Sample stability","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_7b8,pTVar4,(string *)local_6e8,&local_830.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    local_830.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_6e8 != (undefined1  [8])&aStack_6d8) {
    operator_delete((void *)local_6e8,aStack_6d8._M_allocated_capacity + 1);
  }
  iVar12 = findStabilizationSample(this,0x18,"Combined draw and read");
  iVar13 = findStabilizationSample(this,0,"Upload time");
  local_7c4 = findStabilizationSample(this,8,"Draw call time");
  local_7c8 = findStabilizationSample(this,0x10,"ReadPixels time");
  bVar8 = checkSampleTemporalStability(this,0x18,"Combined draw and read");
  bVar9 = checkSampleTemporalStability(this,0,"Upload time");
  bVar10 = checkSampleTemporalStability(this,8,"Draw call time");
  bVar11 = checkSampleTemporalStability(this,0x10,"ReadPixels time");
  tcu::TestLog::endSection((TestLog *)local_7b8._0_8_);
  pTVar4 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_6e8 = (undefined1  [8])&aStack_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"Results","");
  local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"Results","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_210,pTVar4,(string *)local_6e8,&local_830.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    local_830.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_6e8 != (undefined1  [8])&aStack_6d8) {
    operator_delete((void *)local_6e8,aStack_6d8._M_allocated_capacity + 1);
  }
  if (iVar13 != 0) {
    local_6e8 = (undefined1  [8])
                ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_6e0,
               "Warning! Upload times are not stable, test result may not be accurate.",0x46);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6e0);
    std::ios_base::~ios_base(local_670);
  }
  paVar1 = &local_750.m_name.field_2;
  pTVar4 = (TestLog *)(local_7b8 + 0x10);
  paVar2 = &local_6a8.field_2;
  paVar3 = &local_6c8.field_2;
  if ((!bVar10 || !bVar11) || (!bVar8 || !bVar9)) {
    local_6e8 = (undefined1  [8])
                ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_6e0,
               "Warning! Time samples do not seem to be temporally stable, sample times seem to drift to one direction during test execution."
               ,0x7d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6e0);
    std::ios_base::~ios_base(local_670);
  }
  if (iVar12 == -1) {
    local_6e8 = (undefined1  [8])
                ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_6e0,
               "Combined time used in draw call and ReadPixels did not stabilize.",0x41);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6e0);
    std::ios_base::~ios_base(local_670);
  }
  else {
    pTVar7 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_830,"RenderReadStabilizationPoint","");
    local_7b8._0_8_ = pTVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7b8,"Combined draw call and ReadPixels call time stabilization time",
               "");
    local_750.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"frames","");
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_6e8,&local_830.m_name,(string *)local_7b8,&local_750.m_name,
               QP_KEY_TAG_TIME,(long)iVar12);
    tcu::TestLog::writeInteger
              (pTVar7,(char *)local_6e8,local_6c8._M_dataplus._M_p,local_6a8._M_dataplus._M_p,
               local_688,local_680);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != paVar3) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    if (local_6e8 != (undefined1  [8])&aStack_6d8) {
      operator_delete((void *)local_6e8,aStack_6d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_750.m_name._M_dataplus._M_p,
                      local_750.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_7b8._0_8_ != pTVar4) {
      operator_delete((void *)local_7b8._0_8_,local_7a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
      operator_delete(local_830.m_name._M_dataplus._M_p,
                      local_830.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_7c4 == -1) {
    local_6e8 = (undefined1  [8])
                ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_6e0,"Time used in draw call did not stabilize.",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6e0);
    std::ios_base::~ios_base(local_670);
  }
  else {
    pTVar7 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_830,"DrawCallStabilizationPoint","");
    local_7b8._0_8_ = pTVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7b8,"Draw call time stabilization time","");
    local_750.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"frames","");
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_6e8,&local_830.m_name,(string *)local_7b8,&local_750.m_name,
               QP_KEY_TAG_TIME,(long)local_7c4);
    tcu::TestLog::writeInteger
              (pTVar7,(char *)local_6e8,local_6c8._M_dataplus._M_p,local_6a8._M_dataplus._M_p,
               local_688,local_680);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != paVar3) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    if (local_6e8 != (undefined1  [8])&aStack_6d8) {
      operator_delete((void *)local_6e8,aStack_6d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_750.m_name._M_dataplus._M_p,
                      local_750.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_7b8._0_8_ != pTVar4) {
      operator_delete((void *)local_7b8._0_8_,local_7a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
      operator_delete(local_830.m_name._M_dataplus._M_p,
                      local_830.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_7c8 == -1) {
    local_6e8 = (undefined1  [8])
                ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_6e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_6e0,"Time used in ReadPixels did not stabilize.",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_6e0);
    std::ios_base::~ios_base(local_670);
  }
  else {
    pTVar7 = ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_830.m_name._M_dataplus._M_p = (pointer)&local_830.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_830,"ReadPixelsStabilizationPoint","");
    local_7b8._0_8_ = pTVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7b8,"ReadPixels call time stabilization time","");
    local_750.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"frames","");
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_6e8,&local_830.m_name,(string *)local_7b8,&local_750.m_name,
               QP_KEY_TAG_TIME,(long)local_7c8);
    tcu::TestLog::writeInteger
              (pTVar7,(char *)local_6e8,local_6c8._M_dataplus._M_p,local_6a8._M_dataplus._M_p,
               local_688,local_680);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != paVar3) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    if (local_6e8 != (undefined1  [8])&aStack_6d8) {
      operator_delete((void *)local_6e8,aStack_6d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_750.m_name._M_dataplus._M_p,
                      local_750.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_7b8._0_8_ != pTVar4) {
      operator_delete((void *)local_7b8._0_8_,local_7a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
      operator_delete(local_830.m_name._M_dataplus._M_p,
                      local_830.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx;
  if (iVar12 == -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e8);
    std::ostream::operator<<(local_6e8,this->m_numMaxSwaps);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e8);
    std::ios_base::~ios_base(local_678);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_830.m_name._M_dataplus._M_p);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e8);
    std::ostream::operator<<(local_6e8,iVar12);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e8);
    std::ios_base::~ios_base(local_678);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_830.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830.m_name._M_dataplus._M_p != &local_830.m_name.field_2) {
    operator_delete(local_830.m_name._M_dataplus._M_p,
                    local_830.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_210._0_8_);
  return;
}

Assistant:

void UploadWaitDrawCase::logAndSetTestResult (void)
{
	int		uploadStabilization;
	int		renderReadStabilization;
	int		renderStabilization;
	int		readStabilization;
	bool	temporallyStable;

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Samples", "Result samples");
		logSamples();
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Stabilization", "Sample stability");

		// log stabilization points
		renderReadStabilization	= findStabilizationSample(&Result::renderReadDuration, "Combined draw and read");
		uploadStabilization		= findStabilizationSample(&Result::uploadDuration, "Upload time");
		renderStabilization		= findStabilizationSample(&Result::renderDuration, "Draw call time");
		readStabilization		= findStabilizationSample(&Result::readDuration, "ReadPixels time");

		temporallyStable		= true;
		temporallyStable		&= checkSampleTemporalStability(&Result::renderReadDuration, "Combined draw and read");
		temporallyStable		&= checkSampleTemporalStability(&Result::uploadDuration, "Upload time");
		temporallyStable		&= checkSampleTemporalStability(&Result::renderDuration, "Draw call time");
		temporallyStable		&= checkSampleTemporalStability(&Result::readDuration, "ReadPixels time");
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Results", "Results");

		// Check result sanily
		if (uploadStabilization != 0)
			m_testCtx.getLog() << tcu::TestLog::Message << "Warning! Upload times are not stable, test result may not be accurate." << tcu::TestLog::EndMessage;
		if (!temporallyStable)
			m_testCtx.getLog() << tcu::TestLog::Message << "Warning! Time samples do not seem to be temporally stable, sample times seem to drift to one direction during test execution." << tcu::TestLog::EndMessage;

		// render & read
		if (renderReadStabilization == -1)
			m_testCtx.getLog() << tcu::TestLog::Message << "Combined time used in draw call and ReadPixels did not stabilize." << tcu::TestLog::EndMessage;
		else
			m_testCtx.getLog() << tcu::TestLog::Integer("RenderReadStabilizationPoint", "Combined draw call and ReadPixels call time stabilization time", "frames", QP_KEY_TAG_TIME, renderReadStabilization);

		// draw call
		if (renderStabilization == -1)
			m_testCtx.getLog() << tcu::TestLog::Message << "Time used in draw call did not stabilize." << tcu::TestLog::EndMessage;
		else
			m_testCtx.getLog() << tcu::TestLog::Integer("DrawCallStabilizationPoint", "Draw call time stabilization time", "frames", QP_KEY_TAG_TIME, renderStabilization);

		// readpixels
		if (readStabilization == -1)
			m_testCtx.getLog() << tcu::TestLog::Message << "Time used in ReadPixels did not stabilize." << tcu::TestLog::EndMessage;
		else
			m_testCtx.getLog() << tcu::TestLog::Integer("ReadPixelsStabilizationPoint", "ReadPixels call time stabilization time", "frames", QP_KEY_TAG_TIME, readStabilization);

		// Report renderReadStabilization
		if (renderReadStabilization != -1)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(renderReadStabilization).c_str());
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(m_numMaxSwaps).c_str()); // don't report -1
	}
}